

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O0

void lsp::LanguageService::start(string *address,uint32_t port)

{
  element_type *peVar1;
  request_callback local_3b8;
  allocator<char> local_391;
  string local_390;
  request_callback local_370;
  allocator<char> local_349;
  string local_348;
  request_callback local_328;
  allocator<char> local_301;
  string local_300;
  request_callback local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  request_callback local_298;
  allocator<char> local_271;
  string local_270;
  request_callback local_250;
  allocator<char> local_229;
  string local_228;
  request_callback local_208;
  allocator<char> local_1e1;
  string local_1e0;
  request_callback local_1c0;
  allocator<char> local_199;
  string local_198;
  request_callback local_178;
  allocator<char> local_151;
  string local_150;
  notification_callback local_130;
  allocator<char> local_109;
  string local_108;
  notification_callback local_e8;
  allocator<char> local_c1;
  string local_c0;
  notification_callback local_a0;
  allocator<char> local_69;
  string local_68;
  shared_ptr<lsp::XmlParser> local_48;
  shared_ptr<lsp::MessageParser> local_38;
  undefined1 local_28 [28];
  uint32_t port_local;
  string *address_local;
  
  local_28._20_4_ = port;
  unique0x10000b16 = address;
  std::make_shared<lsp::IOHandler,std::__cxx11::string&,unsigned_int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
             (uint *)address);
  std::shared_ptr<lsp::IOHandler>::operator=(&ioHandler_,(shared_ptr<lsp::IOHandler> *)local_28);
  std::shared_ptr<lsp::IOHandler>::~shared_ptr((shared_ptr<lsp::IOHandler> *)local_28);
  std::make_shared<lsp::MessageParser>();
  std::shared_ptr<lsp::MessageParser>::operator=(&messageParser_,&local_38);
  std::shared_ptr<lsp::MessageParser>::~shared_ptr(&local_38);
  std::make_shared<lsp::XmlParser>();
  std::shared_ptr<lsp::XmlParser>::operator=(&xmlParser_,&local_48);
  std::shared_ptr<lsp::XmlParser>::~shared_ptr(&local_48);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"initialized",&local_69);
  std::function<void(jsonrpcpp::Parameter_const&)>::
  function<void(&)(jsonrpcpp::Parameter_const&),void>
            ((function<void(jsonrpcpp::Parameter_const&)> *)&local_a0,notification_initialized);
  MessageParser::register_notification_callback(peVar1,&local_68,&local_a0);
  std::function<void_(const_jsonrpcpp::Parameter_&)>::~function(&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"exit",&local_c1);
  std::function<void(jsonrpcpp::Parameter_const&)>::
  function<void(&)(jsonrpcpp::Parameter_const&),void>
            ((function<void(jsonrpcpp::Parameter_const&)> *)&local_e8,notification_exit);
  MessageParser::register_notification_callback(peVar1,&local_c0,&local_e8);
  std::function<void_(const_jsonrpcpp::Parameter_&)>::~function(&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"workspace/didChangeConfiguration",&local_109);
  std::function<void(jsonrpcpp::Parameter_const&)>::
  function<void(&)(jsonrpcpp::Parameter_const&),void>
            ((function<void(jsonrpcpp::Parameter_const&)> *)&local_130,
             notification_workspace_didChangeConfiguration);
  MessageParser::register_notification_callback(peVar1,&local_108,&local_130);
  std::function<void_(const_jsonrpcpp::Parameter_&)>::~function(&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"initialize",&local_151);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_178,request_initialize);
  MessageParser::register_request_callback(peVar1,&local_150,&local_178);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"shutdown",&local_199);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_1c0,request_shutdown);
  MessageParser::register_request_callback(peVar1,&local_198,&local_1c0);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_1c0);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"textDocument/definition",&local_1e1);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_208,request_textDocument_definition);
  MessageParser::register_request_callback(peVar1,&local_1e0,&local_208);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"textDocument/references",&local_229);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_250,request_textDocument_references);
  MessageParser::register_request_callback(peVar1,&local_228,&local_250);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_250);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"textDocument/hover",&local_271);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_298,request_textDocument_hover);
  MessageParser::register_request_callback(peVar1,&local_270,&local_298);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_298);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"treeView/getChildren",&local_2b9);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_2e0,request_treeView_getChildren);
  MessageParser::register_request_callback(peVar1,&local_2b8,&local_2e0);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"textDocument/goToOwner",&local_301);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_328,request_textDocument_owner);
  MessageParser::register_request_callback(peVar1,&local_300,&local_328);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"treeView/getNearestShortname",&local_349);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_370,request_treeView_getNearestShortname);
  MessageParser::register_request_callback(peVar1,&local_348,&local_370);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_370);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  peVar1 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&messageParser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"treeView/getParentElement",&local_391);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>::
  function<std::shared_ptr<jsonrpcpp::Response>(&)(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&),void>
            ((function<std::shared_ptr<jsonrpcpp::Response>(jsonrpcpp::Id_const&,jsonrpcpp::Parameter_const&)>
              *)&local_3b8,request_treeView_getParentElement);
  MessageParser::register_request_callback(peVar1,&local_390,&local_3b8);
  std::
  function<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
  ::~function(&local_3b8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  run();
  return;
}

Assistant:

void lsp::LanguageService::start(std::string address, uint32_t port)
{
    ioHandler_ = std::make_shared<lsp::IOHandler>(address, port);
    messageParser_ = std::make_shared<lsp::MessageParser>();
    xmlParser_ = std::make_shared<XmlParser>();

    //register Callbacks here
    messageParser_->register_notification_callback("initialized", lsp::LanguageService::notification_initialized);
    messageParser_->register_notification_callback("exit", lsp::LanguageService::notification_exit);
    messageParser_->register_notification_callback("workspace/didChangeConfiguration", lsp::LanguageService::notification_workspace_didChangeConfiguration);
    messageParser_->register_request_callback("initialize", lsp::LanguageService::request_initialize);
    messageParser_->register_request_callback("shutdown", lsp::LanguageService::request_shutdown);
    messageParser_->register_request_callback("textDocument/definition", lsp::LanguageService::request_textDocument_definition);
    messageParser_->register_request_callback("textDocument/references", lsp::LanguageService::request_textDocument_references);
    messageParser_->register_request_callback("textDocument/hover", lsp::LanguageService::request_textDocument_hover);
    messageParser_->register_request_callback("treeView/getChildren", lsp::LanguageService::request_treeView_getChildren);
    messageParser_->register_request_callback("textDocument/goToOwner", lsp::LanguageService::request_textDocument_owner);
    messageParser_->register_request_callback("treeView/getNearestShortname", lsp::LanguageService::request_treeView_getNearestShortname);
    messageParser_->register_request_callback("treeView/getParentElement", lsp::LanguageService::request_treeView_getParentElement);

    //begin the main run loop
    run();
}